

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O3

string * duckdb::SanitizeExportIdentifier(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  pointer pcVar2;
  char cVar3;
  int val;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + str->_M_string_length);
  if (str->_M_string_length != 0) {
    uVar4 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar4];
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar3 = '_';
        if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          val = tolower((int)cVar1);
          cVar3 = NumericCastImpl<char,_int,_false>::Convert(val);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p[uVar4] = cVar3;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string SanitizeExportIdentifier(const string &str) {
	// Copy the original string to result
	string result(str);

	for (idx_t i = 0; i < str.length(); ++i) {
		auto c = str[i];
		if (c >= 'a' && c <= 'z') {
			// If it is lower case just continue
			continue;
		}

		if (c >= 'A' && c <= 'Z') {
			// To lowercase
			result[i] = NumericCast<char>(tolower(c));
		} else {
			// Substitute to underscore
			result[i] = '_';
		}
	}

	return result;
}